

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pgraph_state.cc
# Opt level: O2

bool __thiscall hwtest::pgraph::BetaRegister::scan_test(BetaRegister *this,int cnum,mt19937 *rnd)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  result_type rVar4;
  uint uVar5;
  
  uVar2 = 0;
  do {
    uVar5 = uVar2;
    if (uVar5 == 1000) goto LAB_0019c2d1;
    rVar4 = std::
            mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
            ::operator()(rnd);
    (*(this->super_SimpleMmioRegister).super_MmioRegister.super_Register._vptr_Register[7])
              (this,cnum,rVar4 & 0xffffffff);
    uVar1 = (uint)rVar4 & 0x7f800000;
    if ((int)(uint)rVar4 < 0) {
      uVar1 = 0;
    }
    uVar3 = (*(this->super_SimpleMmioRegister).super_MmioRegister.super_Register._vptr_Register[6])
                      (this,cnum);
    uVar2 = uVar5 + 1;
  } while (uVar3 == uVar1);
  printf("BETA scan mismatch: orig %08x expected %08x real %08x\n",rVar4 & 0xffffffff,(ulong)uVar1,
         (ulong)uVar3);
LAB_0019c2d1:
  return uVar5 < 1000;
}

Assistant:

bool scan_test(int cnum, std::mt19937 &rnd) override {
		for (int i = 0; i < 1000; i++) {
			uint32_t orig = rnd();
			write(cnum, orig);
			uint32_t exp = orig & 0x7f800000;
			if (orig & 0x80000000)
				exp = 0;
			uint32_t real = read(cnum);
			if (real != exp) {
				printf("BETA scan mismatch: orig %08x expected %08x real %08x\n", orig, exp, real);
				return true;
			}
		}
		return false;
	}